

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_old_swift_struct_result_writer
          (t_swift_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  int32_t iVar2;
  ostream *poVar3;
  string *psVar4;
  members_type *this_00;
  reference pptVar5;
  string *psVar6;
  t_type *type;
  string local_98;
  t_field *local_78;
  t_field *tfield;
  t_field **local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  name.field_2._8_8_ = tstruct;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"private static func writeValue(__value: ");
  psVar4 = (string *)(**(code **)(*(long *)name.field_2._8_8_ + 0x18))();
  poVar3 = std::operator<<(poVar3,psVar4);
  std::operator<<(poVar3,", toProtocol __proto: TProtocol) throws");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  psVar4 = (string *)(**(code **)(*(long *)name.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string((string *)&fields,psVar4);
  this_00 = t_struct::get_members((t_struct *)name.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_60);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeStructBeginWithName(\"");
  poVar3 = std::operator<<(poVar3,(string *)&fields);
  poVar3 = std::operator<<(poVar3,"\")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  local_68 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  local_60._M_current = local_68;
  while( true ) {
    tfield = (t_field *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&tfield);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    local_78 = *pptVar5;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"if let result = __value.");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::operator<<(poVar3,(string *)psVar6);
    block_open(this,out);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try __proto.writeFieldValue(result, ");
    poVar3 = std::operator<<(poVar3,"name: \"");
    psVar6 = t_field::get_name_abi_cxx11_(local_78);
    poVar3 = std::operator<<(poVar3,(string *)psVar6);
    poVar3 = std::operator<<(poVar3,"\", ");
    poVar3 = std::operator<<(poVar3,"type: ");
    type = t_field::get_type(local_78);
    type_to_enum_abi_cxx11_(&local_98,this,type,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"id: ");
    iVar2 = t_field::get_key(local_78);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    block_close(this,out,true);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_60);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeFieldStop()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeStructEnd()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct_result_writer(ostream& out, t_struct* tstruct) {

  indent(out) << "private static func writeValue(__value: " << tstruct->get_name()
              << ", toProtocol __proto: TProtocol) throws";
  block_open(out);
  out << endl;
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "try __proto.writeStructBeginWithName(\"" << name << "\")" << endl;
  out << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field *tfield = *f_iter;

    indent(out) << "if let result = __value." << (*f_iter)->get_name();

    block_open(out);

    indent(out) << "try __proto.writeFieldValue(result, "
                << "name: \"" << tfield->get_name() << "\", "
                << "type: " << type_to_enum(tfield->get_type()) << ", "
                << "id: " << tfield->get_key() << ")" << endl;

    block_close(out);
  }
  // Write the struct map
  indent(out) << "try __proto.writeFieldStop()" << endl << endl;
  indent(out) << "try __proto.writeStructEnd()" << endl;
  block_close(out);
  out << endl;
}